

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

bool __thiscall crnlib::crn_comp::create_comp_data(crn_comp *this)

{
  vector<unsigned_char> *this_00;
  ushort uVar1;
  crn_comp_params *pcVar2;
  uchar *puVar3;
  uint16 uVar4;
  uint uVar5;
  uchar *puVar6;
  uint i_1;
  crn_uint32 cVar7;
  uint i;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint i_2;
  vector<unsigned_char> *b;
  ulong uVar11;
  int iVar12;
  uint level_ofs [16];
  uint local_78 [18];
  
  *(undefined8 *)((this->m_crn_header).m_alpha_selectors.m_ofs.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_tables_size.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_color_selectors.m_num.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_alpha_endpoints.m_num.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_userdata1.m_buf + 3) = 0;
  *(undefined8 *)((this->m_crn_header).m_color_endpoints.m_num.m_buf + 1) = 0;
  (this->m_crn_header).m_levels = (uchar  [1])0x0;
  (this->m_crn_header).m_faces = (uchar  [1])0x0;
  (this->m_crn_header).m_format = (uchar  [1])0x0;
  (this->m_crn_header).m_flags = (uchar  [2])0x0;
  (this->m_crn_header).m_reserved.m_buf[0] = '\0';
  (this->m_crn_header).m_reserved.m_buf[1] = '\0';
  (this->m_crn_header).m_reserved.m_buf[2] = '\0';
  *(undefined8 *)((this->m_crn_header).m_reserved.m_buf + 3) = 0;
  (this->m_crn_header).m_sig = (uchar  [2])0x0;
  (this->m_crn_header).m_header_size = (uchar  [2])0x0;
  (this->m_crn_header).m_header_crc16 = (uchar  [2])0x0;
  (this->m_crn_header).m_data_size.m_buf[0] = '\0';
  (this->m_crn_header).m_data_size.m_buf[1] = '\0';
  *(undefined8 *)((this->m_crn_header).m_data_size.m_buf + 2) = 0;
  pcVar2 = this->m_pParams;
  uVar1 = (ushort)pcVar2->m_width;
  *(ushort *)(this->m_crn_header).m_width.m_buf = uVar1 << 8 | uVar1 >> 8;
  uVar1 = (ushort)pcVar2->m_height;
  *(ushort *)(this->m_crn_header).m_height.m_buf = uVar1 << 8 | uVar1 >> 8;
  (this->m_crn_header).m_levels.m_buf[0] = (uchar)pcVar2->m_levels;
  (this->m_crn_header).m_faces.m_buf[0] = (uchar)pcVar2->m_faces;
  (this->m_crn_header).m_format.m_buf[0] = (char)pcVar2->m_format;
  cVar7 = pcVar2->m_userdata0;
  lVar9 = 0;
  do {
    (this->m_crn_header).m_userdata0.m_buf[lVar9] = (uchar)(cVar7 >> 0x18);
    cVar7 = cVar7 << 8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  cVar7 = pcVar2->m_userdata1;
  lVar9 = 0;
  do {
    (this->m_crn_header).m_userdata1.m_buf[lVar9] = (uchar)(cVar7 >> 0x18);
    cVar7 = cVar7 << 8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  this_00 = &this->m_comp_data;
  puVar3 = (this->m_comp_data).m_p;
  if (puVar3 != (uchar *)0x0) {
    crnlib_free(puVar3);
    this_00->m_p = (uchar *)0x0;
    (this->m_comp_data).m_size = 0;
    (this->m_comp_data).m_capacity = 0;
  }
  vector<unsigned_char>::reserve(this_00,0x200000);
  append_vec(this_00,&this->m_crn_header,0x4a);
  uVar10 = this->m_pParams->m_levels;
  if ((uVar10 & 0x3fffffff) != 1) {
    uVar5 = (this->m_comp_data).m_size;
    uVar10 = (uVar5 + uVar10 * 4) - 4;
    if (uVar5 <= uVar10) {
      if ((this->m_comp_data).m_capacity < uVar10) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar10,false,1,(object_mover)0x0,false);
        uVar5 = (this->m_comp_data).m_size;
      }
      memset(this_00->m_p + uVar5,0,(ulong)(uVar10 - uVar5));
    }
    (this->m_comp_data).m_size = uVar10;
  }
  uVar8 = (this->m_packed_color_endpoints).m_size;
  if (uVar8 != 0) {
    uVar1 = (ushort)(this->m_color_endpoints).m_size;
    *(ushort *)(this->m_crn_header).m_color_endpoints.m_num.m_buf = uVar1 << 8 | uVar1 >> 8;
    lVar9 = -3;
    do {
      (this->m_crn_header).m_color_endpoints.m_num.m_buf[lVar9] = (uchar)(uVar8 >> 0x10);
      lVar9 = lVar9 + 1;
      uVar8 = uVar8 << 8;
    } while (lVar9 != 0);
    lVar9 = -3;
    uVar8 = (this->m_comp_data).m_size;
    do {
      (this->m_crn_header).m_color_endpoints.m_size.m_buf[lVar9] = (uchar)(uVar8 >> 0x10);
      lVar9 = lVar9 + 1;
      uVar8 = uVar8 << 8;
    } while (lVar9 != 0);
    append_vec(this_00,&this->m_packed_color_endpoints);
  }
  uVar8 = (this->m_packed_color_selectors).m_size;
  if (uVar8 != 0) {
    uVar1 = (ushort)(this->m_color_selectors).m_size;
    *(ushort *)(this->m_crn_header).m_color_selectors.m_num.m_buf = uVar1 << 8 | uVar1 >> 8;
    lVar9 = -3;
    do {
      (this->m_crn_header).m_color_selectors.m_num.m_buf[lVar9] = (uchar)(uVar8 >> 0x10);
      lVar9 = lVar9 + 1;
      uVar8 = uVar8 << 8;
    } while (lVar9 != 0);
    lVar9 = -3;
    uVar8 = (this->m_comp_data).m_size;
    do {
      (this->m_crn_header).m_color_selectors.m_size.m_buf[lVar9] = (uchar)(uVar8 >> 0x10);
      lVar9 = lVar9 + 1;
      uVar8 = uVar8 << 8;
    } while (lVar9 != 0);
    append_vec(this_00,&this->m_packed_color_selectors);
  }
  uVar8 = (this->m_packed_alpha_endpoints).m_size;
  if (uVar8 != 0) {
    uVar1 = (ushort)(this->m_alpha_endpoints).m_size;
    *(ushort *)(this->m_crn_header).m_alpha_endpoints.m_num.m_buf = uVar1 << 8 | uVar1 >> 8;
    lVar9 = -3;
    do {
      (this->m_crn_header).m_alpha_endpoints.m_num.m_buf[lVar9] = (uchar)(uVar8 >> 0x10);
      lVar9 = lVar9 + 1;
      uVar8 = uVar8 << 8;
    } while (lVar9 != 0);
    lVar9 = -3;
    uVar8 = (this->m_comp_data).m_size;
    do {
      (this->m_crn_header).m_alpha_endpoints.m_size.m_buf[lVar9] = (uchar)(uVar8 >> 0x10);
      lVar9 = lVar9 + 1;
      uVar8 = uVar8 << 8;
    } while (lVar9 != 0);
    append_vec(this_00,&this->m_packed_alpha_endpoints);
  }
  uVar8 = (this->m_packed_alpha_selectors).m_size;
  if (uVar8 != 0) {
    uVar1 = (ushort)(this->m_alpha_selectors).m_size;
    *(ushort *)(this->m_crn_header).m_alpha_selectors.m_num.m_buf = uVar1 << 8 | uVar1 >> 8;
    lVar9 = -3;
    do {
      (this->m_crn_header).m_alpha_selectors.m_num.m_buf[lVar9] = (uchar)(uVar8 >> 0x10);
      lVar9 = lVar9 + 1;
      uVar8 = uVar8 << 8;
    } while (lVar9 != 0);
    lVar9 = -3;
    uVar8 = (this->m_comp_data).m_size;
    do {
      (this->m_crn_header).m_alpha_selectors.m_size.m_buf[lVar9] = (uchar)(uVar8 >> 0x10);
      lVar9 = lVar9 + 1;
      uVar8 = uVar8 << 8;
    } while (lVar9 != 0);
    append_vec(this_00,&this->m_packed_alpha_selectors);
  }
  lVar9 = -3;
  uVar8 = (this->m_comp_data).m_size;
  do {
    (this->m_crn_header).m_level_ofs[0].m_buf[lVar9] = (uchar)(uVar8 >> 0x10);
    lVar9 = lVar9 + 1;
    uVar8 = uVar8 << 8;
  } while (lVar9 != 0);
  uVar1 = (ushort)(this->m_packed_data_models).m_size;
  *(ushort *)(this->m_crn_header).m_tables_size.m_buf = uVar1 << 8 | uVar1 >> 8;
  append_vec(this_00,&this->m_packed_data_models);
  if ((this->m_levels).m_size != 0) {
    b = this->m_packed_blocks;
    uVar11 = 0;
    do {
      local_78[uVar11] = (this->m_comp_data).m_size;
      append_vec(this_00,b);
      uVar11 = uVar11 + 1;
      b = b + 1;
    } while (uVar11 < (this->m_levels).m_size);
  }
  puVar3 = (this->m_comp_data).m_p;
  memcpy(puVar3,&this->m_crn_header,0x4a);
  if ((this->m_levels).m_size == 0) {
    iVar12 = 0;
  }
  else {
    puVar6 = puVar3 + 0x46;
    uVar11 = 0;
    do {
      uVar8 = local_78[uVar11];
      lVar9 = 0;
      do {
        puVar6[lVar9] = (uchar)(uVar8 >> 0x18);
        uVar8 = uVar8 << 8;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      uVar11 = uVar11 + 1;
      uVar10 = (this->m_levels).m_size;
      puVar6 = puVar6 + 4;
    } while (uVar11 < uVar10);
    iVar12 = uVar10 << 2;
  }
  puVar3[0] = 'H';
  puVar3[1] = 'x';
  uVar8 = (this->m_comp_data).m_size;
  lVar9 = 0;
  do {
    (puVar3 + 6)[lVar9] = (uchar)(uVar8 >> 0x18);
    uVar8 = uVar8 << 8;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  uVar10 = iVar12 + 0x46;
  uVar4 = crc16((this->m_comp_data).m_p + uVar10,(ulong)((this->m_comp_data).m_size - uVar10),0);
  *(uint16 *)(puVar3 + 10) = uVar4 << 8 | uVar4 >> 8;
  puVar3[2] = (uchar)(uVar10 >> 8);
  puVar3[3] = (uchar)uVar10;
  uVar4 = crc16(puVar3 + 6,(ulong)(iVar12 + 0x40),0);
  *(uint16 *)(puVar3 + 4) = uVar4 << 8 | uVar4 >> 8;
  return true;
}

Assistant:

bool crn_comp::create_comp_data() {
  utils::zero_object(m_crn_header);

  m_crn_header.m_width = static_cast<uint16>(m_pParams->m_width);
  m_crn_header.m_height = static_cast<uint16>(m_pParams->m_height);
  m_crn_header.m_levels = static_cast<uint8>(m_pParams->m_levels);
  m_crn_header.m_faces = static_cast<uint8>(m_pParams->m_faces);
  m_crn_header.m_format = static_cast<uint8>(m_pParams->m_format);
  m_crn_header.m_userdata0 = m_pParams->m_userdata0;
  m_crn_header.m_userdata1 = m_pParams->m_userdata1;

  m_comp_data.clear();
  m_comp_data.reserve(2 * 1024 * 1024);
  append_vec(m_comp_data, &m_crn_header, sizeof(m_crn_header));
  // tack on the rest of the variable size m_level_ofs array
  m_comp_data.resize(m_comp_data.size() + sizeof(m_crn_header.m_level_ofs[0]) * (m_pParams->m_levels - 1));

  if (m_packed_color_endpoints.size()) {
    m_crn_header.m_color_endpoints.m_num = static_cast<uint16>(m_color_endpoints.size());
    m_crn_header.m_color_endpoints.m_size = m_packed_color_endpoints.size();
    m_crn_header.m_color_endpoints.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_color_endpoints);
  }

  if (m_packed_color_selectors.size()) {
    m_crn_header.m_color_selectors.m_num = static_cast<uint16>(m_color_selectors.size());
    m_crn_header.m_color_selectors.m_size = m_packed_color_selectors.size();
    m_crn_header.m_color_selectors.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_color_selectors);
  }

  if (m_packed_alpha_endpoints.size()) {
    m_crn_header.m_alpha_endpoints.m_num = static_cast<uint16>(m_alpha_endpoints.size());
    m_crn_header.m_alpha_endpoints.m_size = m_packed_alpha_endpoints.size();
    m_crn_header.m_alpha_endpoints.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_alpha_endpoints);
  }

  if (m_packed_alpha_selectors.size()) {
    m_crn_header.m_alpha_selectors.m_num = static_cast<uint16>(m_alpha_selectors.size());
    m_crn_header.m_alpha_selectors.m_size = m_packed_alpha_selectors.size();
    m_crn_header.m_alpha_selectors.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_alpha_selectors);
  }

  m_crn_header.m_tables_ofs = m_comp_data.size();
  m_crn_header.m_tables_size = m_packed_data_models.size();
  append_vec(m_comp_data, m_packed_data_models);

  uint level_ofs[cCRNMaxLevels];
  for (uint i = 0; i < m_levels.size(); i++) {
    level_ofs[i] = m_comp_data.size();
    append_vec(m_comp_data, m_packed_blocks[i]);
  }

  crnd::crn_header& dst_header = *(crnd::crn_header*)&m_comp_data[0];
  // don't change the m_comp_data vector - or dst_header will be invalidated!

  memcpy(&dst_header, &m_crn_header, sizeof(dst_header));

  for (uint i = 0; i < m_levels.size(); i++)
    dst_header.m_level_ofs[i] = level_ofs[i];

  const uint actual_header_size = sizeof(crnd::crn_header) + sizeof(dst_header.m_level_ofs[0]) * (m_levels.size() - 1);

  dst_header.m_sig = crnd::crn_header::cCRNSigValue;

  dst_header.m_data_size = m_comp_data.size();
  dst_header.m_data_crc16 = crc16(&m_comp_data[actual_header_size], m_comp_data.size() - actual_header_size);

  dst_header.m_header_size = actual_header_size;
  dst_header.m_header_crc16 = crc16(&dst_header.m_data_size, actual_header_size - (uint)((uint8*)&dst_header.m_data_size - (uint8*)&dst_header));

  return true;
}